

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

void __thiscall NodeKey::NodeKey(NodeKey *this)

{
  NodeKey *this_local;
  
  this->m_flags = 0;
  this->m_nodeIndex = 0xffffffff;
  this->m_size1 = 0;
  this->m_size2 = 0;
  this->m_volumeIndex = 0xffffffff;
  this->m_sectorIndex = 0;
  return;
}

Assistant:

NodeKey()
		: m_flags(0)
		, m_nodeIndex(INVALID_INDEX)
		, m_size1(0)
		, m_size2(0)
		, m_volumeIndex(INVALID_INDEX)
		, m_sectorIndex(0)
	{
	}